

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m3x3.cpp
# Opt level: O0

void M3x3_ExtractEulerAngles_XZX(double (*matrix) [3],double *angles)

{
  double *in_RSI;
  double *in_RDI;
  double ax2;
  double az;
  double ax1;
  double local_30;
  double local_28;
  double local_20;
  double local_18;
  
  if ((*in_RDI != 9999999.0) || (NAN(*in_RDI))) {
    if (*in_RDI <= 0.0) {
      local_30 = -*in_RDI;
    }
    else {
      local_30 = *in_RDI;
    }
    if (local_30 <= 0.9999) {
      local_20 = acos(*in_RDI);
      local_18 = atan2(in_RDI[6],in_RDI[3]);
      local_28 = atan2(in_RDI[2],-in_RDI[1]);
    }
    else {
      local_20 = 0.0;
      local_18 = 0.0;
      local_28 = atan2(in_RDI[7],in_RDI[8]);
    }
    *in_RSI = local_18 * 57.29577951308232;
    in_RSI[1] = local_20 * 57.29577951308232;
    in_RSI[2] = (local_28 + local_18) * 57.29577951308232;
    if (180.0 < in_RSI[2]) {
      in_RSI[2] = in_RSI[2] - 360.0;
    }
    if (in_RSI[2] <= -180.0 && in_RSI[2] != -180.0) {
      in_RSI[2] = in_RSI[2] + 360.0;
    }
    if (180.0 < *in_RSI) {
      *in_RSI = *in_RSI - 360.0;
    }
    if (*in_RSI <= -180.0 && *in_RSI != -180.0) {
      *in_RSI = *in_RSI + 360.0;
    }
  }
  else {
    *in_RSI = 9999999.0;
    in_RSI[1] = 9999999.0;
    in_RSI[2] = 9999999.0;
  }
  return;
}

Assistant:

void M3x3_ExtractEulerAngles_XZX(
  const double matrix[3][3],
  double angles[3])
{
    double ax1,az,ax2;

/*
   R[XZX] = Rx1 * Rz * Rx2

            | 1     0     0 |   | cz   -sz   0 |   | 1     0     0 |
          = | 0   cx1  -sx1 | * | sz    cz   0 | * | 0   cx2  -sx2 |
            | 0   sx1   cx1 |   |  0     0   1 |   | 0   sx2   cx2 |

            |    cz                -szcx2                 szsx2 |
          = | cx1sz    -sx1sx2 + cx1czcx2    -sx1cx2 - cx1czsx2 |
            | sx1sz     cx1sx2 + sx1czcx2     cx1cx2 - sx1czsx2 |
*/

    if (matrix[0][0] == XEMPTY)
    {
        angles[0] = XEMPTY;
        angles[1] = XEMPTY;
        angles[2] = XEMPTY;
        return;
    }

    if (ABS(matrix[0][0]) > 0.9999)
    {
        az = 0.0;
        ax1 = 0.0; // The ay1 rotation is only to accomplish the ax rotation.
        ax2 = atan2(matrix[2][1], matrix[2][2]);
    }
    else
    {
        az = acos(matrix[0][0]); // 0 <= az <= 180 by definition
        ax1 = atan2(matrix[2][0], matrix[1][0]);
        ax2 = atan2(matrix[0][2],-matrix[0][1]);
    }

    angles[0] = ax1 * (180.0/M_PI);
    angles[1] = az * (180.0/M_PI);
    angles[2] = (ax2+ax1) * (180.0/M_PI);
    //angles[2] = ax2 * (180.0/M_PI);

    if (angles[2] > +180.0) angles[2] -= 360.0;
    if (angles[2] < -180.0) angles[2] += 360.0;

    if (angles[0] > +180.0) angles[0] -= 360.0;
    if (angles[0] < -180.0) angles[0] += 360.0;
}